

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *entropy,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  void *workspace;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  uint local_c0;
  uint local_bc;
  size_t local_b8;
  size_t local_b0;
  short local_a8 [60];
  
  sVar6 = 0xffffffffffffffe2;
  if (8 < dictSize) {
    if (*dict != -0x13cf5bc9) {
      __assert_fail("MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5dc2,
                    "size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *, const void *const, const size_t)"
                   );
    }
    sVar2 = HUF_readDTableX2_wksp
                      (entropy->hufTable,(void *)((long)dict + 8),dictSize - 8,entropy,0x2818);
    if (sVar2 < 0xffffffffffffff89) {
      uVar8 = dictSize + (long)dict;
      pvVar7 = (void *)((long)dict + sVar2 + 8);
      local_bc = 0x1f;
      sVar3 = FSE_readNCount(local_a8,&local_bc,&local_c0,pvVar7,uVar8 - (long)pvVar7);
      if (((sVar3 < 0xffffffffffffff89) && (local_bc < 0x20)) && (local_c0 < 9)) {
        ZSTD_buildFSETable(entropy->OFTable,local_a8,local_bc,OF_base,OF_bits,local_c0);
        pvVar7 = (void *)((long)pvVar7 + sVar3);
        local_bc = 0x34;
        local_b8 = FSE_readNCount(local_a8,&local_bc,&local_c0,pvVar7,uVar8 - (long)pvVar7);
        if (((local_b8 < 0xffffffffffffff89) && (local_bc < 0x35)) && (local_c0 < 10)) {
          ZSTD_buildFSETable(entropy->MLTable,local_a8,local_bc,ML_base,ML_bits,local_c0);
          pvVar7 = (void *)((long)pvVar7 + local_b8);
          local_bc = 0x23;
          local_b0 = FSE_readNCount(local_a8,&local_bc,&local_c0,pvVar7,uVar8 - (long)pvVar7);
          if (((local_b0 < 0xffffffffffffff89) && (local_bc < 0x24)) && (local_c0 < 10)) {
            ZSTD_buildFSETable(entropy->LLTable,local_a8,local_bc,LL_base,LL_bits,local_c0);
            uVar4 = (long)pvVar7 + local_b0 + 0xc;
            if (uVar4 <= uVar8) {
              lVar5 = 0;
              do {
                uVar1 = *(uint *)((long)pvVar7 + lVar5 + local_b0);
                if ((ulong)uVar1 == 0) {
                  return 0xffffffffffffffe2;
                }
                if (uVar8 - uVar4 < (ulong)uVar1) {
                  return 0xffffffffffffffe2;
                }
                *(uint *)((long)entropy->rep + lVar5) = uVar1;
                lVar5 = lVar5 + 4;
              } while (lVar5 != 0xc);
              sVar6 = local_b8 + local_b0 + sVar2 + sVar3 + 0x14;
            }
          }
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t
ZSTD_loadDEntropy(ZSTD_entropyDTables_t* entropy,
                  const void* const dict, size_t const dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;

    RETURN_ERROR_IF(dictSize <= 8, dictionary_corrupted);
    assert(MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY);   /* dict must be valid */
    dictPtr += 8;   /* skip header = magic + dictID */

    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, OFTable) == offsetof(ZSTD_entropyDTables_t, LLTable) + sizeof(entropy->LLTable));
    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, MLTable) == offsetof(ZSTD_entropyDTables_t, OFTable) + sizeof(entropy->OFTable));
    ZSTD_STATIC_ASSERT(sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable) >= HUF_DECOMPRESS_WORKSPACE_SIZE);
    {   void* const workspace = &entropy->LLTable;   /* use fse tables as temporary workspace; implies fse tables are grouped together */
        size_t const workspaceSize = sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable);
#ifdef HUF_FORCE_DECOMPRESS_X1
        /* in minimal huffman, we always use X1 variants */
        size_t const hSize = HUF_readDTableX1_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#else
        size_t const hSize = HUF_readDTableX2_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#endif
        RETURN_ERROR_IF(HUF_isError(hSize), dictionary_corrupted);
        dictPtr += hSize;
    }

    {   short offcodeNCount[MaxOff+1];
        unsigned offcodeMaxValue = MaxOff, offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(offcodeMaxValue > MaxOff, dictionary_corrupted);
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted);
        ZSTD_buildFSETable( entropy->OFTable,
                            offcodeNCount, offcodeMaxValue,
                            OF_base, OF_bits,
                            offcodeLog);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(matchlengthMaxValue > MaxML, dictionary_corrupted);
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted);
        ZSTD_buildFSETable( entropy->MLTable,
                            matchlengthNCount, matchlengthMaxValue,
                            ML_base, ML_bits,
                            matchlengthLog);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(litlengthMaxValue > MaxLL, dictionary_corrupted);
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted);
        ZSTD_buildFSETable( entropy->LLTable,
                            litlengthNCount, litlengthMaxValue,
                            LL_base, LL_bits,
                            litlengthLog);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted);
    {   int i;
        size_t const dictContentSize = (size_t)(dictEnd - (dictPtr+12));
        for (i=0; i<3; i++) {
            U32 const rep = MEM_readLE32(dictPtr); dictPtr += 4;
            RETURN_ERROR_IF(rep==0 || rep > dictContentSize,
                            dictionary_corrupted);
            entropy->rep[i] = rep;
    }   }

    return dictPtr - (const BYTE*)dict;
}